

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

Node * __thiscall anon_unknown.dwarf_4f39de::Db::parseFunctionParam(Db *this)

{
  char *pcVar1;
  bool bVar2;
  FunctionParam *pFVar3;
  StringView S;
  StringView SVar4;
  StringView Num;
  StringView local_20;
  
  SVar4.Last = "";
  SVar4.First = "fp";
  bVar2 = consumeIf(this,SVar4);
  if (!bVar2) {
    S.Last = "";
    S.First = "fL";
    bVar2 = consumeIf(this,S);
    if (!bVar2) {
      return (Node *)0x0;
    }
    SVar4 = parseNumber(this,false);
    if (SVar4.First == SVar4.Last) {
      return (Node *)0x0;
    }
    pcVar1 = this->First;
    if (pcVar1 == this->Last) {
      return (Node *)0x0;
    }
    if (*pcVar1 != 'p') {
      return (Node *)0x0;
    }
    this->First = pcVar1 + 1;
  }
  parseCVQualifiers(this);
  local_20 = parseNumber(this,false);
  pcVar1 = this->First;
  if (pcVar1 == this->Last) {
    return (Node *)0x0;
  }
  if (*pcVar1 != '_') {
    return (Node *)0x0;
  }
  this->First = pcVar1 + 1;
  pFVar3 = (anonymous_namespace)::Db::make<(anonymous_namespace)::FunctionParam,StringView&>
                     ((Db *)this,&local_20);
  return (Node *)pFVar3;
}

Assistant:

Node *Db::parseFunctionParam() {
  if (consumeIf("fp")) {
    parseCVQualifiers();
    StringView Num = parseNumber();
    if (!consumeIf('_'))
      return nullptr;
    return make<FunctionParam>(Num);
  }
  if (consumeIf("fL")) {
    if (parseNumber().empty())
      return nullptr;
    if (!consumeIf('p'))
      return nullptr;
    parseCVQualifiers();
    StringView Num = parseNumber();
    if (!consumeIf('_'))
      return nullptr;
    return make<FunctionParam>(Num);
  }
  return nullptr;
}